

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputBufferedStream.cpp
# Opt level: O0

void __thiscall OutputBufferedStream::~OutputBufferedStream(OutputBufferedStream *this)

{
  OutputBufferedStream *this_local;
  
  (this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter =
       (_func_int **)&PTR__OutputBufferedStream_0054e678;
  Flush(this);
  if (this->mBuffer != (Byte *)0x0) {
    operator_delete__(this->mBuffer);
  }
  if (this->mTargetStream != (IByteWriterWithPosition *)0x0) {
    (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[1])();
  }
  IByteWriterWithPosition::~IByteWriterWithPosition(&this->super_IByteWriterWithPosition);
  return;
}

Assistant:

OutputBufferedStream::~OutputBufferedStream(void)
{
	Flush();
	delete[] mBuffer;
	delete mTargetStream;
}